

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

uhugeint_t
duckdb::TryCastCInternal<float,duckdb::uhugeint_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  uhugeint_t uVar2;
  uhugeint_t result_value;
  uhugeint_t local_40;
  uhugeint_t local_30 [2];
  
  bVar1 = TryCast::Operation<float,duckdb::uhugeint_t>
                    (*(float *)((long)result->deprecated_columns[col].deprecated_data + row * 4),
                     &local_40,false);
  if (!bVar1) {
    uhugeint_t::uhugeint_t(local_30,0);
    local_40.lower = local_30[0].lower;
    local_40.upper = local_30[0].upper;
  }
  uVar2.upper = local_40.upper;
  uVar2.lower = local_40.lower;
  return uVar2;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}